

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LYD_FORMAT lyd_parse_get_format(ly_in *in,LYD_FORMAT format)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong uVar4;
  
  if (format == LYD_UNKNOWN) {
    format = LYD_UNKNOWN;
    if (in->type == LY_IN_FILEPATH) {
      __s = (in->method).fpath.filepath;
      sVar2 = strlen(__s);
      do {
        uVar4 = sVar2;
        if (uVar4 == 0) {
          return LYD_UNKNOWN;
        }
        ppuVar3 = __ctype_b_loc();
        sVar2 = uVar4 - 1;
      } while ((*(byte *)((long)*ppuVar3 + (long)__s[uVar4 - 1] * 2 + 1) & 0x20) != 0);
      format = LYD_UNKNOWN;
      if (4 < uVar4) {
        iVar1 = strncmp(__s + (uVar4 - 4),".xml",4);
        if (iVar1 == 0) {
          format = LYD_XML;
        }
        else if ((uVar4 == 5) || (iVar1 = strncmp(__s + (uVar4 - 5),".json",5), iVar1 != 0)) {
          iVar1 = strncmp(__s + (uVar4 - 4),".lyb",4);
          format = (uint)(iVar1 == 0) * 3;
        }
        else {
          format = LYD_JSON;
        }
      }
    }
  }
  return format;
}

Assistant:

static LYD_FORMAT
lyd_parse_get_format(const struct ly_in *in, LYD_FORMAT format)
{
    if (!format && (in->type == LY_IN_FILEPATH)) {
        /* unknown format - try to detect it from filename's suffix */
        const char *path = in->method.fpath.filepath;
        size_t len = strlen(path);

        /* ignore trailing whitespaces */
        for ( ; len > 0 && isspace(path[len - 1]); len--) {}

        if ((len >= LY_XML_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_XML_SUFFIX_LEN], LY_XML_SUFFIX, LY_XML_SUFFIX_LEN)) {
            format = LYD_XML;
        } else if ((len >= LY_JSON_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_JSON_SUFFIX_LEN], LY_JSON_SUFFIX, LY_JSON_SUFFIX_LEN)) {
            format = LYD_JSON;
        } else if ((len >= LY_LYB_SUFFIX_LEN + 1) &&
                !strncmp(&path[len - LY_LYB_SUFFIX_LEN], LY_LYB_SUFFIX, LY_LYB_SUFFIX_LEN)) {
            format = LYD_LYB;
        } /* else still unknown */
    }

    return format;
}